

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_sPLT(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  png_bytep ppVar5;
  ushort *puVar6;
  byte *pbVar7;
  png_size_t max_dl;
  png_uint_32 dl;
  png_uint_32 skip;
  int i;
  int entry_size;
  png_uint_32 data_length;
  png_sPLT_entryp pp;
  png_sPLT_t new_palette;
  png_bytep buffer;
  png_bytep entry_start;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if (png_ptr->user_chunk_cache_max != 0) {
    if (png_ptr->user_chunk_cache_max == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    pVar1 = png_ptr->user_chunk_cache_max - 1;
    png_ptr->user_chunk_cache_max = pVar1;
    if (pVar1 == 1) {
      png_warning(png_ptr,"No space in chunk cache for sPLT");
      png_crc_finish(png_ptr,length);
      return;
    }
  }
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) == 0) {
      new_palette._24_8_ = png_read_buffer(png_ptr,(ulong)(length + 1),2);
      if ((png_bytep)new_palette._24_8_ == (png_bytep)0x0) {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"out of memory");
      }
      else {
        png_crc_read(png_ptr,(png_bytep)new_palette._24_8_,length);
        iVar2 = png_crc_finish(png_ptr,0);
        if (iVar2 == 0) {
          *(undefined1 *)(new_palette._24_8_ + (ulong)length) = 0;
          for (buffer = (png_bytep)new_palette._24_8_; *buffer != '\0'; buffer = buffer + 1) {
          }
          ppVar5 = buffer + 1;
          if ((length < 2) || ((png_bytep)(new_palette._24_8_ + (ulong)(length - 2)) < ppVar5)) {
            png_warning(png_ptr,"malformed sPLT chunk");
          }
          else {
            buffer = buffer + 2;
            new_palette.name._0_1_ = *ppVar5;
            uVar3 = 10;
            if ((png_byte)new_palette.name == '\b') {
              uVar3 = 6;
            }
            uVar4 = length - ((int)buffer - new_palette.nentries);
            if (uVar4 % uVar3 == 0) {
              if ((ulong)(uVar4 / uVar3) < 0x199999999999999a) {
                new_palette.entries._0_4_ = uVar4 / uVar3;
                new_palette._8_8_ =
                     png_malloc_warn(png_ptr,(long)(int)(uint)new_palette.entries * 10);
                if ((png_voidp)new_palette._8_8_ == (png_voidp)0x0) {
                  png_warning(png_ptr,"sPLT chunk requires too much memory");
                }
                else {
                  for (dl = 0; (int)dl < (int)(uint)new_palette.entries; dl = dl + 1) {
                    puVar6 = (ushort *)(new_palette._8_8_ + (long)(int)dl * 10);
                    if ((png_byte)new_palette.name == '\b') {
                      *puVar6 = (ushort)*buffer;
                      puVar6[1] = (ushort)buffer[1];
                      pbVar7 = buffer + 3;
                      puVar6[2] = (ushort)buffer[2];
                      buffer = buffer + 4;
                      puVar6[3] = (ushort)*pbVar7;
                    }
                    else {
                      *puVar6 = (ushort)*buffer * 0x100 + (ushort)buffer[1];
                      puVar6[1] = (ushort)buffer[2] * 0x100 + (ushort)buffer[3];
                      puVar6[2] = (ushort)buffer[4] * 0x100 + (ushort)buffer[5];
                      puVar6[3] = (ushort)buffer[6] * 0x100 + (ushort)buffer[7];
                      buffer = buffer + 8;
                    }
                    puVar6[4] = (ushort)*buffer * 0x100 + (ushort)buffer[1];
                    buffer = buffer + 2;
                  }
                  pp = (png_sPLT_entryp)new_palette._24_8_;
                  png_set_sPLT(png_ptr,info_ptr,(png_const_sPLT_tp)&pp,1);
                  png_free(png_ptr,(png_voidp)new_palette._8_8_);
                }
              }
              else {
                png_warning(png_ptr,"sPLT chunk too long");
              }
            }
            else {
              png_warning(png_ptr,"sPLT chunk has bad length");
            }
          }
        }
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_sPLT(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
/* Note: this does not properly handle chunks that are > 64K under DOS */
{
   png_bytep entry_start, buffer;
   png_sPLT_t new_palette;
   png_sPLT_entryp pp;
   png_uint_32 data_length;
   int entry_size, i;
   png_uint_32 skip = 0;
   png_uint_32 dl;
   png_size_t max_dl;

   png_debug(1, "in png_handle_sPLT");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_warning(png_ptr, "No space in chunk cache for sPLT");
         png_crc_finish(png_ptr, length);
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

#ifdef PNG_MAX_MALLOC_64K
   if (length > 65535U)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too large to fit in memory");
      return;
   }
#endif

   buffer = png_read_buffer(png_ptr, length+1, 2/*silent*/);
   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }


   /* WARNING: this may break if size_t is less than 32 bits; it is assumed
    * that the PNG_MAX_MALLOC_64K test is enabled in this case, but this is a
    * potential breakage point if the types in pngconf.h aren't exactly right.
    */
   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, skip) != 0)
      return;

   buffer[length] = 0;

   for (entry_start = buffer; *entry_start; entry_start++)
      /* Empty loop to find end of name */ ;

   ++entry_start;

   /* A sample depth should follow the separator, and we should be on it  */
   if (length < 2U || entry_start > buffer + (length - 2U))
   {
      png_warning(png_ptr, "malformed sPLT chunk");
      return;
   }

   new_palette.depth = *entry_start++;
   entry_size = (new_palette.depth == 8 ? 6 : 10);
   /* This must fit in a png_uint_32 because it is derived from the original
    * chunk data length.
    */
   data_length = length - (png_uint_32)(entry_start - buffer);

   /* Integrity-check the data length */
   if ((data_length % (unsigned int)entry_size) != 0)
   {
      png_warning(png_ptr, "sPLT chunk has bad length");
      return;
   }

   dl = (png_uint_32)(data_length / (unsigned int)entry_size);
   max_dl = PNG_SIZE_MAX / (sizeof (png_sPLT_entry));

   if (dl > max_dl)
   {
      png_warning(png_ptr, "sPLT chunk too long");
      return;
   }

   new_palette.nentries = (png_int_32)(data_length / (unsigned int)entry_size);

   new_palette.entries = (png_sPLT_entryp)png_malloc_warn(png_ptr,
       (png_alloc_size_t) new_palette.nentries * (sizeof (png_sPLT_entry)));

   if (new_palette.entries == NULL)
   {
      png_warning(png_ptr, "sPLT chunk requires too much memory");
      return;
   }

#ifdef PNG_POINTER_INDEXING_SUPPORTED
   for (i = 0; i < new_palette.nentries; i++)
   {
      pp = new_palette.entries + i;

      if (new_palette.depth == 8)
      {
         pp->red = *entry_start++;
         pp->green = *entry_start++;
         pp->blue = *entry_start++;
         pp->alpha = *entry_start++;
      }

      else
      {
         pp->red   = png_get_uint_16(entry_start); entry_start += 2;
         pp->green = png_get_uint_16(entry_start); entry_start += 2;
         pp->blue  = png_get_uint_16(entry_start); entry_start += 2;
         pp->alpha = png_get_uint_16(entry_start); entry_start += 2;
      }

      pp->frequency = png_get_uint_16(entry_start); entry_start += 2;
   }
#else
   pp = new_palette.entries;

   for (i = 0; i < new_palette.nentries; i++)
   {

      if (new_palette.depth == 8)
      {
         pp[i].red   = *entry_start++;
         pp[i].green = *entry_start++;
         pp[i].blue  = *entry_start++;
         pp[i].alpha = *entry_start++;
      }

      else
      {
         pp[i].red   = png_get_uint_16(entry_start); entry_start += 2;
         pp[i].green = png_get_uint_16(entry_start); entry_start += 2;
         pp[i].blue  = png_get_uint_16(entry_start); entry_start += 2;
         pp[i].alpha = png_get_uint_16(entry_start); entry_start += 2;
      }

      pp[i].frequency = png_get_uint_16(entry_start); entry_start += 2;
   }
#endif

   /* Discard all chunk data except the name and stash that */
   new_palette.name = (png_charp)buffer;

   png_set_sPLT(png_ptr, info_ptr, &new_palette, 1);

   png_free(png_ptr, new_palette.entries);
}